

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::BrandedDecl(BrandedDecl *this,BrandedDecl *other)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  BrandScope *pBVar4;
  Disposer *pDVar5;
  BrandScope *pBVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  StructDataBitCount SVar14;
  int iVar15;
  undefined4 uVar16;
  void *pvVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  StructPointerCount SVar23;
  undefined2 uVar24;
  Refcounted *refcounted;
  
  uVar3 = (other->body).tag;
  (this->body).tag = uVar3;
  if ((other->body).tag == 1) {
    *(undefined8 *)((long)&(this->body).field_1 + 0x20) =
         *(undefined8 *)((long)&(other->body).field_1 + 0x20);
    pvVar17 = (other->body).field_1.forceAligned;
    uVar18 = *(undefined8 *)((long)&(other->body).field_1 + 8);
    uVar19 = *(undefined8 *)((long)&(other->body).field_1 + 0x18);
    *(undefined8 *)((long)&(this->body).field_1 + 0x10) =
         *(undefined8 *)((long)&(other->body).field_1 + 0x10);
    *(undefined8 *)((long)&(this->body).field_1 + 0x18) = uVar19;
    (this->body).field_1.forceAligned = pvVar17;
    *(undefined8 *)((long)&(this->body).field_1 + 8) = uVar18;
    bVar2 = (other->body).field_1.space[0x28];
    (this->body).field_1.space[0x28] = bVar2;
    if (bVar2 == '\x01') {
      uVar18 = *(undefined8 *)((long)&(other->body).field_1 + 0x30);
      uVar19 = *(undefined8 *)((long)&(other->body).field_1 + 0x38);
      uVar20 = *(undefined8 *)((long)&(other->body).field_1 + 0x40);
      uVar21 = *(undefined8 *)((long)&(other->body).field_1 + 0x48);
      uVar22 = *(undefined8 *)((long)&(other->body).field_1 + 0x58);
      *(undefined8 *)((long)&(this->body).field_1 + 0x50) =
           *(undefined8 *)((long)&(other->body).field_1 + 0x50);
      *(undefined8 *)((long)&(this->body).field_1 + 0x58) = uVar22;
      *(undefined8 *)((long)&(this->body).field_1 + 0x40) = uVar20;
      *(undefined8 *)((long)&(this->body).field_1 + 0x48) = uVar21;
      *(undefined8 *)((long)&(this->body).field_1 + 0x30) = uVar18;
      *(undefined8 *)((long)&(this->body).field_1 + 0x38) = uVar19;
    }
  }
  if ((other->body).tag == 2) {
    uVar18 = *(undefined8 *)((long)&(other->body).field_1 + 8);
    (this->body).field_1.forceAligned = (other->body).field_1.forceAligned;
    *(undefined8 *)((long)&(this->body).field_1 + 8) = uVar18;
  }
  (this->brand).disposer = (Disposer *)0x0;
  (this->brand).ptr = (BrandScope *)0x0;
  uVar7 = *(undefined4 *)((long)&(other->source)._reader.segment + 4);
  uVar8 = *(undefined4 *)&(other->source)._reader.capTable;
  uVar9 = *(undefined4 *)((long)&(other->source)._reader.capTable + 4);
  uVar10 = *(undefined4 *)&(other->source)._reader.data;
  uVar11 = *(undefined4 *)((long)&(other->source)._reader.data + 4);
  uVar12 = *(undefined4 *)&(other->source)._reader.pointers;
  uVar13 = *(undefined4 *)((long)&(other->source)._reader.pointers + 4);
  SVar14 = (other->source)._reader.dataSize;
  SVar23 = (other->source)._reader.pointerCount;
  uVar24 = *(undefined2 *)&(other->source)._reader.field_0x26;
  iVar15 = (other->source)._reader.nestingLimit;
  uVar16 = *(undefined4 *)&(other->source)._reader.field_0x2c;
  *(undefined4 *)&(this->source)._reader.segment = *(undefined4 *)&(other->source)._reader.segment;
  *(undefined4 *)((long)&(this->source)._reader.segment + 4) = uVar7;
  *(undefined4 *)&(this->source)._reader.capTable = uVar8;
  *(undefined4 *)((long)&(this->source)._reader.capTable + 4) = uVar9;
  *(undefined4 *)&(this->source)._reader.data = uVar10;
  *(undefined4 *)((long)&(this->source)._reader.data + 4) = uVar11;
  *(undefined4 *)&(this->source)._reader.pointers = uVar12;
  *(undefined4 *)((long)&(this->source)._reader.pointers + 4) = uVar13;
  (this->source)._reader.dataSize = SVar14;
  (this->source)._reader.pointerCount = SVar23;
  *(undefined2 *)&(this->source)._reader.field_0x26 = uVar24;
  (this->source)._reader.nestingLimit = iVar15;
  *(undefined4 *)&(this->source)._reader.field_0x2c = uVar16;
  if (uVar3 == 1) {
    pBVar4 = (other->brand).ptr;
    puVar1 = &(pBVar4->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    pDVar5 = (this->brand).disposer;
    pBVar6 = (this->brand).ptr;
    (this->brand).disposer = (Disposer *)pBVar4;
    (this->brand).ptr = pBVar4;
    if (pBVar6 != (BrandScope *)0x0) {
      (**pDVar5->_vptr_Disposer)
                (pDVar5,(pBVar6->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                        (long)&(pBVar6->super_Refcounted).super_Disposer._vptr_Disposer);
    }
  }
  return;
}

Assistant:

NodeTranslator::BrandedDecl::BrandedDecl(BrandedDecl& other)
    : body(other.body),
      source(other.source) {
  if (body.is<Resolver::ResolvedDecl>()) {
    brand = kj::addRef(*other.brand);
  }
}